

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O3

void __thiscall
YAML::SingleDocParser::ParseProperties
          (SingleDocParser *this,string *tag,anchor_t *anchor,string *anchor_name)

{
  bool bVar1;
  Token *pTVar2;
  Scanner *this_00;
  
  tag->_M_string_length = 0;
  *(tag->_M_dataplus)._M_p = '\0';
  anchor_name->_M_string_length = 0;
  *(anchor_name->_M_dataplus)._M_p = '\0';
  *anchor = 0;
  this_00 = this->m_scanner;
  do {
    bVar1 = Scanner::empty(this_00);
    if (bVar1) {
      return;
    }
    pTVar2 = Scanner::peek(this->m_scanner);
    if (pTVar2->type == ANCHOR) {
      ParseAnchor(this,anchor,anchor_name);
    }
    else {
      if (pTVar2->type != TAG) {
        return;
      }
      ParseTag(this,tag);
    }
    this_00 = this->m_scanner;
  } while( true );
}

Assistant:

void SingleDocParser::ParseProperties(std::string& tag, anchor_t& anchor,
                                      std::string& anchor_name) {
  tag.clear();
  anchor_name.clear();
  anchor = NullAnchor;

  while (true) {
    if (m_scanner.empty())
      return;

    switch (m_scanner.peek().type) {
      case Token::TAG:
        ParseTag(tag);
        break;
      case Token::ANCHOR:
        ParseAnchor(anchor, anchor_name);
        break;
      default:
        return;
    }
  }
}